

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O0

pod_vector<Clasp::OutputTable::PredType,_std::allocator<Clasp::OutputTable::PredType>_> * __thiscall
bk_lib::pod_vector<Clasp::OutputTable::PredType,_std::allocator<Clasp::OutputTable::PredType>_>::
operator=(pod_vector<Clasp::OutputTable::PredType,_std::allocator<Clasp::OutputTable::PredType>_>
          *this,pod_vector<Clasp::OutputTable::PredType,_std::allocator<Clasp::OutputTable::PredType>_>
                *other)

{
  const_iterator last;
  PredType *in_RSI;
  PredType *in_RDI;
  
  if (in_RDI != in_RSI) {
    last = begin((pod_vector<Clasp::OutputTable::PredType,_std::allocator<Clasp::OutputTable::PredType>_>
                  *)in_RSI);
    end((pod_vector<Clasp::OutputTable::PredType,_std::allocator<Clasp::OutputTable::PredType>_> *)
        in_RSI);
    pod_vector<Clasp::OutputTable::PredType,std::allocator<Clasp::OutputTable::PredType>>::
    assign<Clasp::OutputTable::PredType_const*>
              ((pod_vector<Clasp::OutputTable::PredType,_std::allocator<Clasp::OutputTable::PredType>_>
                *)in_RSI,in_RDI,last);
  }
  return (pod_vector<Clasp::OutputTable::PredType,_std::allocator<Clasp::OutputTable::PredType>_> *)
         in_RDI;
}

Assistant:

pod_vector& operator=(const pod_vector& other) {
		if (this != &other) {
			assign(other.begin(), other.end());
		}
		return *this;
	}